

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O3

Bdc_Fun_t * Bdc_ManDecompose_rec(Bdc_Man_t *p,Bdc_Isf_t *pIsf)

{
  Bdc_Fun_t *pBVar1;
  int iVar2;
  Bdc_Type_t Type;
  int iVar3;
  Bdc_Fun_t *pBVar4;
  Bdc_Fun_t *pBVar5;
  long lVar6;
  Bdc_Isf_t *pIsfL;
  ulong uVar7;
  long lVar8;
  Bdc_Isf_t IsfL;
  timespec ts_3;
  Bdc_Isf_t IsfB;
  Bdc_Isf_t local_68;
  timespec local_50;
  Bdc_Isf_t local_40;
  
  uVar7 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
  if (p->nVars < 6) {
    uVar7 = 1;
  }
  while (0 < (int)uVar7) {
    lVar8 = uVar7 - 1;
    lVar6 = uVar7 - 1;
    uVar7 = uVar7 - 1;
    if ((pIsf->puOn[lVar6] & pIsf->puOff[lVar8]) != 0) {
      __assert_fail("Kit_TruthIsDisjoint(pIsf->puOn, pIsf->puOff, p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/bdc/bdcDec.c"
                    ,0x2b3,"Bdc_Fun_t *Bdc_ManDecompose_rec(Bdc_Man_t *, Bdc_Isf_t *)");
    }
  }
  if (p->pPars->fVerbose == 0) {
    lVar8 = 0;
  }
  else {
    iVar2 = clock_gettime(3,(timespec *)&local_68);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = (long)local_68.puOn / 1000 + local_68._0_8_ * 1000000;
    }
  }
  pBVar4 = Bdc_TableLookup(p,pIsf);
  if (p->pPars->fVerbose != 0) {
    iVar2 = clock_gettime(3,(timespec *)&local_68);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = (long)local_68.puOn / 1000 + local_68._0_8_ * 1000000;
    }
    p->timeCache = p->timeCache + (lVar6 - lVar8);
  }
  if (pBVar4 != (Bdc_Fun_t *)0x0) {
    return pBVar4;
  }
  if (p->pPars->fVerbose != 0) {
    iVar2 = clock_gettime(3,(timespec *)&local_68);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = (long)local_68.puOn / 1000 + local_68._0_8_ * 1000000;
    }
  }
  Type = Bdc_DecomposeStep(p,pIsf,&local_68,&local_40);
  if (p->pPars->fVerbose != 0) {
    iVar2 = clock_gettime(3,&local_50);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    p->timeCheck = p->timeCheck + (lVar6 - lVar8);
  }
  if (Type == BDC_TYPE_MUX) {
    if (p->pPars->fVerbose != 0) {
      iVar2 = clock_gettime(3,&local_50);
      if (iVar2 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
    }
    iVar2 = Bdc_DecomposeStepMux(p,pIsf,&local_68,&local_40);
    if (p->pPars->fVerbose != 0) {
      iVar3 = clock_gettime(3,&local_50);
      if (iVar3 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->timeMuxes = p->timeMuxes + (lVar6 - lVar8);
    }
    p->numMuxes = p->numMuxes + 1;
    pBVar4 = Bdc_ManDecompose_rec(p,&local_68);
    pBVar5 = Bdc_ManDecompose_rec(p,&local_40);
    if (pBVar5 != (Bdc_Fun_t *)0x0 && pBVar4 != (Bdc_Fun_t *)0x0) {
      if (p->nNodes <= iVar2 + 1) {
        __assert_fail("Id < p->nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/bdc/bdcInt.h"
                      ,0x81,"Bdc_Fun_t *Bdc_FunWithId(Bdc_Man_t *, int)");
      }
      pBVar1 = p->pNodes;
      pBVar4 = Bdc_ManCreateGate(p,(Bdc_Fun_t *)((ulong)(pBVar1 + (iVar2 + 1)) ^ 1),pBVar4,
                                 BDC_TYPE_AND);
      pBVar5 = Bdc_ManCreateGate(p,pBVar1 + (iVar2 + 1),pBVar5,BDC_TYPE_AND);
      if (pBVar5 != (Bdc_Fun_t *)0x0 && pBVar4 != (Bdc_Fun_t *)0x0) {
        Type = BDC_TYPE_OR;
LAB_0052d9e5:
        pBVar4 = Bdc_ManCreateGate(p,pBVar4,pBVar5,Type);
        return pBVar4;
      }
    }
  }
  else {
    pBVar4 = Bdc_ManDecompose_rec(p,&local_68);
    if (pBVar4 != (Bdc_Fun_t *)0x0) {
      iVar2 = Bdc_DecomposeUpdateRight(p,pIsf,&local_68,&local_40,pBVar4,Type);
      if (iVar2 != 0) {
        p->nNodesNew = p->nNodesNew + -1;
        return pBVar4;
      }
      Bdc_SuppMinimize(p,&local_40);
      pBVar5 = Bdc_ManDecompose_rec(p,&local_40);
      if (pBVar5 != (Bdc_Fun_t *)0x0) goto LAB_0052d9e5;
    }
  }
  return (Bdc_Fun_t *)0x0;
}

Assistant:

Bdc_Fun_t * Bdc_ManDecompose_rec( Bdc_Man_t * p, Bdc_Isf_t * pIsf )
{
//    int static Counter = 0;
//    int LocalCounter = Counter++;
    Bdc_Type_t Type;
    Bdc_Fun_t * pFunc, * pFunc0, * pFunc1;
    Bdc_Isf_t IsfL, * pIsfL = &IsfL;
    Bdc_Isf_t IsfB, * pIsfR = &IsfB;
    int iVar;
    abctime clk = 0; // Suppress "might be used uninitialized"
/*
printf( "Init function (%d):\n", LocalCounter );
Extra_PrintBinary( stdout, pIsf->puOn, 1<<4 );printf("\n");
Extra_PrintBinary( stdout, pIsf->puOff, 1<<4 );printf("\n");
*/
    // check computed results
    assert( Kit_TruthIsDisjoint(pIsf->puOn, pIsf->puOff, p->nVars) );
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    pFunc = Bdc_TableLookup( p, pIsf );
    if ( p->pPars->fVerbose )
        p->timeCache += Abc_Clock() - clk;
    if ( pFunc )
        return pFunc;
    // decide on the decomposition type
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    Type = Bdc_DecomposeStep( p, pIsf, pIsfL, pIsfR );
    if ( p->pPars->fVerbose )
        p->timeCheck += Abc_Clock() - clk;
    if ( Type == BDC_TYPE_MUX )
    {
        if ( p->pPars->fVerbose )
            clk = Abc_Clock();
        iVar = Bdc_DecomposeStepMux( p, pIsf, pIsfL, pIsfR );
        if ( p->pPars->fVerbose )
            p->timeMuxes += Abc_Clock() - clk;
        p->numMuxes++;
        pFunc0 = Bdc_ManDecompose_rec( p, pIsfL );
        pFunc1 = Bdc_ManDecompose_rec( p, pIsfR );
        if ( pFunc0 == NULL || pFunc1 == NULL )
            return NULL;
        pFunc  = Bdc_FunWithId( p, iVar + 1 );
        pFunc0 = Bdc_ManCreateGate( p, Bdc_Not(pFunc), pFunc0, BDC_TYPE_AND );
        pFunc1 = Bdc_ManCreateGate( p, pFunc,  pFunc1, BDC_TYPE_AND );
        if ( pFunc0 == NULL || pFunc1 == NULL )
            return NULL;
        pFunc = Bdc_ManCreateGate( p, pFunc0, pFunc1, BDC_TYPE_OR );
    }
    else
    {
        pFunc0 = Bdc_ManDecompose_rec( p, pIsfL );
        if ( pFunc0 == NULL )
            return NULL;
        // decompose the right branch
        if ( Bdc_DecomposeUpdateRight( p, pIsf, pIsfL, pIsfR, pFunc0, Type ) )
        {
            p->nNodesNew--;
            return pFunc0;
        }
        Bdc_SuppMinimize( p, pIsfR );
        pFunc1 = Bdc_ManDecompose_rec( p, pIsfR );
        if ( pFunc1 == NULL )
            return NULL;
        // create new gate
        pFunc = Bdc_ManCreateGate( p, pFunc0, pFunc1, Type );
    }
    return pFunc;
}